

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmBcc<(moira::Instr)18,(moira::Mode)12,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  StrWriter *pSVar2;
  Av<(moira::Instr)18,_(moira::Mode)12,_1> local_54;
  UInt local_50;
  int local_4c;
  UInt local_44;
  int local_40;
  Av<(moira::Instr)18,_(moira::Mode)12,_1> local_38;
  UInt local_34;
  int local_30;
  u32 local_28;
  u16 local_22;
  u32 dst;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  local_22._0_1_ = (char)op;
  local_28 = *addr + 2 + (int)(char)local_22;
  SVar1 = str->style->syntax;
  local_22 = op;
  _dst = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  if (SVar1 - GNU < 2) {
    pSVar2 = StrWriter::operator<<(str);
    pSVar2 = StrWriter::operator<<(pSVar2);
    local_40 = addr_local[0xe];
    pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_40);
    UInt::UInt(&local_44,local_28);
    StrWriter::operator<<(pSVar2,local_44);
  }
  else if (SVar1 == MUSASHI) {
    if ((char)local_22 == -1) {
      dasmIllegal<(moira::Instr)18,(moira::Mode)12,1>(this,str,addr,op);
    }
    else {
      pSVar2 = StrWriter::operator<<(str);
      local_30 = addr_local[0xe];
      pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_30);
      UInt::UInt(&local_34,local_28);
      pSVar2 = StrWriter::operator<<(pSVar2,local_34);
      local_38.ext1 = 0;
      StrWriter::operator<<(pSVar2,&local_38);
    }
  }
  else {
    pSVar2 = StrWriter::operator<<(str);
    local_4c = addr_local[0xe];
    pSVar2 = StrWriter::operator<<(pSVar2,(Tab)local_4c);
    UInt::UInt(&local_50,local_28);
    pSVar2 = StrWriter::operator<<(pSVar2,local_50);
    local_54.ext1 = 0;
    StrWriter::operator<<(pSVar2,&local_54);
  }
  return;
}

Assistant:

void
Moira::dasmBcc(StrWriter &str, u32 &addr, u16 op) const
{
    u32 dst = addr;
    U32_INC(dst, 2);
    U32_INC(dst, S == Byte ? (i8)op : SEXT<S>(dasmIncRead<S>(addr)));

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            if (S == Byte && (u8)op == 0xFF) {

                dasmIllegal<I, M, S>(str, addr, op);
                break;
            }

            str << Ins<I>{} << str.tab << UInt(dst) << Av<I, M, S>{};
            break;

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << Szb<S>{} << str.tab << UInt(dst);
            break;

        default:

            str << Ins<I>{} << str.tab << UInt(dst) << Av<I, M, S>{};
            break;
    }
}